

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O0

void __thiscall KDReports::Test::test4000SmallCells(Test *this)

{
  double dVar1;
  byte bVar2;
  bool bVar3;
  TableBreakingPageOrder TVar4;
  int iVar5;
  AutoTableElement *pAVar6;
  reference pQVar7;
  QDebug *this_00;
  QList<QRect> *pQVar8;
  QRect local_2a8;
  QRect local_298;
  QRect local_288;
  QRect local_278;
  QRect local_268;
  QRect local_258;
  QList<QRect> local_248;
  QList<QRect> local_230;
  QRect local_218;
  QList<QRect> local_208;
  QRect local_1f0;
  QList<QRect> local_1e0;
  QRect local_1c8;
  QList<QRect> local_1b8;
  QRect local_1a0;
  QList<QRect> local_190;
  QRect local_178;
  QList<QRect> local_168;
  QRect local_150;
  QList<QRect> local_140;
  QList<QRect> local_128;
  int local_10c;
  int columns;
  QDebug local_e8;
  QList<QRect> local_e0;
  int local_c4;
  int rows;
  QDebug local_a0;
  undefined4 local_94;
  QLatin1String local_90;
  QString local_80;
  QFont local_68 [8];
  QFont font;
  AutoTableElement local_58 [8];
  AutoTableElement tableElement;
  Report local_28 [8];
  Report report;
  Test *this_local;
  
  fillModel(this,0x28,100,true);
  KDReports::Report::Report(local_28,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)local_28);
  KDReports::AutoTableElement::AutoTableElement(local_58,(QAbstractItemModel *)&this->m_model);
  KDReports::AutoTableElement::setVerticalHeaderVisible(SUB81(local_58,0));
  KDReports::AbstractTableElement::setPadding(3.0);
  pAVar6 = (AutoTableElement *)KDReports::Report::mainTable();
  KDReports::MainTable::setAutoTableElement(pAVar6);
  QLatin1String::QLatin1String(&local_90,"Arial");
  QString::QString(&local_80,local_90);
  QFont::QFont(local_68,&local_80,-1,-1,false);
  QString::~QString(&local_80);
  QFont::setPixelSize((int)local_68);
  KDReports::Report::setDefaultFont((QFont *)local_28);
  KDReports::Report::scaleTo((int)local_28,2);
  TVar4 = KDReports::Report::mainTable();
  KDReports::MainTable::setTableBreakingPageOrder(TVar4);
  iVar5 = KDReports::Report::numberOfPages();
  bVar2 = QTest::qCompare(iVar5,6,"report.numberOfPages()","6",
                          "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                          ,0x136);
  if ((bVar2 & 1) == 0) {
    local_94 = 1;
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)&stack0xffffffffffffff40,
               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
               ,0x13a,"void KDReports::Test::test4000SmallCells()");
    QMessageLogger::debug();
    KDReports::Report::mainTable();
    dVar1 = (double)KDReports::MainTable::lastAutoFontScalingFactor();
    QDebug::operator<<(&local_a0,dVar1);
    QDebug::~QDebug(&local_a0);
    KDReports::Report::mainTable();
    dVar1 = (double)KDReports::MainTable::lastAutoFontScalingFactor();
    bVar2 = QTest::qVerify(0.45 <= dVar1,"report.mainTable()->lastAutoFontScalingFactor() >= 0.45",
                           "",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0x141);
    if ((bVar2 & 1) == 0) {
      local_94 = 1;
    }
    else {
      KDReports::Report::mainTable();
      dVar1 = (double)KDReports::MainTable::lastAutoFontScalingFactor();
      bVar2 = QTest::qVerify(dVar1 <= 0.5,"report.mainTable()->lastAutoFontScalingFactor() <= 0.50",
                             "",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                             ,0x142);
      if ((bVar2 & 1) == 0) {
        local_94 = 1;
      }
      else {
        KDReports::Report::mainTable();
        KDReports::MainTable::pageRects();
        pQVar7 = QList<QRect>::operator[](&local_e0,0);
        iVar5 = QRect::height(pQVar7);
        QList<QRect>::~QList(&local_e0);
        local_c4 = iVar5;
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)&stack0xfffffffffffffef8,
                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                   ,0x145,"void KDReports::Test::test4000SmallCells()");
        QMessageLogger::debug();
        this_00 = QDebug::operator<<(&local_e8,local_c4);
        QDebug::operator<<(this_00,"rows");
        QDebug::~QDebug(&local_e8);
        bVar2 = QTest::qVerify(0x24 < local_c4,"rows >= 37","",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0x146);
        if ((bVar2 & 1) == 0) {
          local_94 = 1;
        }
        else {
          bVar2 = QTest::qVerify(local_c4 < 0x31,"rows <= 48","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                 ,0x147);
          if ((bVar2 & 1) == 0) {
            local_94 = 1;
          }
          else {
            KDReports::Report::mainTable();
            KDReports::MainTable::pageRects();
            pQVar7 = QList<QRect>::operator[](&local_128,0);
            iVar5 = QRect::width(pQVar7);
            QList<QRect>::~QList(&local_128);
            local_10c = iVar5;
            bVar2 = QTest::qVerify(0x13 < iVar5,"columns >= 20","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                   ,0x149);
            if ((bVar2 & 1) == 0) {
              local_94 = 1;
            }
            else {
              bVar2 = QTest::qVerify(local_10c < 0x16,"columns <= 21","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                     ,0x14a);
              if ((bVar2 & 1) == 0) {
                local_94 = 1;
              }
              else {
                KDReports::Report::mainTable();
                KDReports::MainTable::pageRects();
                pQVar7 = QList<QRect>::operator[](&local_140,0);
                QRect::QRect(&local_150,0,0,local_10c,local_c4);
                bVar3 = QTest::qCompare<QRect,QRect>
                                  (pQVar7,&local_150,"report.mainTable()->pageRects()[0]",
                                   "QRect(0, 0, columns, rows)",
                                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                   ,0x14d);
                QList<QRect>::~QList(&local_140);
                if (((bVar3 ^ 0xffU) & 1) == 0) {
                  KDReports::Report::mainTable();
                  KDReports::MainTable::pageRects();
                  pQVar7 = QList<QRect>::operator[](&local_168,1);
                  QRect::QRect(&local_178,local_10c,0,0x28 - local_10c,local_c4);
                  bVar3 = QTest::qCompare<QRect,QRect>
                                    (pQVar7,&local_178,"report.mainTable()->pageRects()[1]",
                                     "QRect(columns, 0, 40 - columns, rows)",
                                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                     ,0x14e);
                  QList<QRect>::~QList(&local_168);
                  if (((bVar3 ^ 0xffU) & 1) == 0) {
                    KDReports::Report::mainTable();
                    KDReports::MainTable::pageRects();
                    pQVar7 = QList<QRect>::operator[](&local_190,2);
                    QRect::QRect(&local_1a0,0,local_c4,local_10c,local_c4);
                    bVar3 = QTest::qCompare<QRect,QRect>
                                      (pQVar7,&local_1a0,"report.mainTable()->pageRects()[2]",
                                       "QRect(0, rows, columns, rows)",
                                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                       ,0x14f);
                    QList<QRect>::~QList(&local_190);
                    if (((bVar3 ^ 0xffU) & 1) == 0) {
                      KDReports::Report::mainTable();
                      KDReports::MainTable::pageRects();
                      pQVar7 = QList<QRect>::operator[](&local_1b8,3);
                      QRect::QRect(&local_1c8,local_10c,local_c4,0x28 - local_10c,local_c4);
                      bVar3 = QTest::qCompare<QRect,QRect>
                                        (pQVar7,&local_1c8,"report.mainTable()->pageRects()[3]",
                                         "QRect(columns, rows, 40 - columns, rows)",
                                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                         ,0x150);
                      QList<QRect>::~QList(&local_1b8);
                      if (((bVar3 ^ 0xffU) & 1) == 0) {
                        KDReports::Report::mainTable();
                        KDReports::MainTable::pageRects();
                        pQVar7 = QList<QRect>::operator[](&local_1e0,4);
                        QRect::QRect(&local_1f0,0,local_c4 * 2,local_10c,local_c4 * -2 + 100);
                        bVar3 = QTest::qCompare<QRect,QRect>
                                          (pQVar7,&local_1f0,"report.mainTable()->pageRects()[4]",
                                           "QRect(0, 2 * rows, columns, 100 - 2 * rows)",
                                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                           ,0x151);
                        QList<QRect>::~QList(&local_1e0);
                        if (((bVar3 ^ 0xffU) & 1) == 0) {
                          KDReports::Report::mainTable();
                          KDReports::MainTable::pageRects();
                          pQVar7 = QList<QRect>::operator[](&local_208,5);
                          QRect::QRect(&local_218,local_10c,local_c4 * 2,0x28 - local_10c,
                                       local_c4 * -2 + 100);
                          bVar3 = QTest::qCompare<QRect,QRect>
                                            (pQVar7,&local_218,"report.mainTable()->pageRects()[5]",
                                             "QRect(columns, 2 * rows, 40 - columns, 100 - 2 * rows)"
                                             ,
                                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                             ,0x152);
                          QList<QRect>::~QList(&local_208);
                          if (((bVar3 ^ 0xffU) & 1) == 0) {
                            KDReports::Report::setTableBreakingPageOrder
                                      ((TableBreakingPageOrder)local_28);
                            KDReports::Report::mainTable();
                            KDReports::MainTable::pageRects();
                            local_248.d.d = (Data *)0x0;
                            local_248.d.ptr = (QRect *)0x0;
                            local_248.d.size = 0;
                            QList<QRect>::QList(&local_248);
                            QRect::QRect(&local_258,0,0,local_10c,local_c4);
                            pQVar8 = QList<QRect>::operator<<(&local_248,&local_258);
                            QRect::QRect(&local_268,0,local_c4,local_10c,local_c4);
                            pQVar8 = QList<QRect>::operator<<(pQVar8,&local_268);
                            QRect::QRect(&local_278,0,local_c4 * 2,local_10c,local_c4 * -2 + 100);
                            pQVar8 = QList<QRect>::operator<<(pQVar8,&local_278);
                            QRect::QRect(&local_288,local_10c,0,0x28 - local_10c,local_c4);
                            pQVar8 = QList<QRect>::operator<<(pQVar8,&local_288);
                            QRect::QRect(&local_298,local_10c,local_c4,0x28 - local_10c,local_c4);
                            pQVar8 = QList<QRect>::operator<<(pQVar8,&local_298);
                            QRect::QRect(&local_2a8,local_10c,local_c4 * 2,0x28 - local_10c,
                                         local_c4 * -2 + 100);
                            pQVar8 = QList<QRect>::operator<<(pQVar8,&local_2a8);
                            bVar3 = QTest::qCompare<QRect>
                                              (&local_230,pQVar8,"report.mainTable()->pageRects()",
                                               "QList<QRect>() << QRect(0, 0, columns, rows) << QRect(0, rows, columns, rows) << QRect(0, 2 * rows, columns, 100 - 2 * rows) << QRect(columns, 0, 40 - columns, rows) << QRect(columns, rows, 40 - columns, rows) << QRect(columns, 2 * rows, 40 - columns, 100 - 2 * rows)"
                                               ,
                                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                               ,0x158);
                            QList<QRect>::~QList(&local_248);
                            QList<QRect>::~QList(&local_230);
                            if (((bVar3 ^ 0xffU) & 1) == 0) {
                              local_94 = 0;
                            }
                            else {
                              local_94 = 1;
                            }
                          }
                          else {
                            local_94 = 1;
                          }
                        }
                        else {
                          local_94 = 1;
                        }
                      }
                      else {
                        local_94 = 1;
                      }
                    }
                    else {
                      local_94 = 1;
                    }
                  }
                  else {
                    local_94 = 1;
                  }
                }
                else {
                  local_94 = 1;
                }
              }
            }
          }
        }
      }
    }
  }
  QFont::~QFont(local_68);
  KDReports::AutoTableElement::~AutoTableElement(local_58);
  KDReports::Report::~Report(local_28);
  return;
}

Assistant:

void test4000SmallCells()
    {
        fillModel(40, 100, true /*small cells*/);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        AutoTableElement tableElement(&m_model);
        tableElement.setVerticalHeaderVisible(false);
        tableElement.setPadding(3);
        report.mainTable()->setAutoTableElement(tableElement);
        QFont font(QLatin1String("Arial"));
        font.setPixelSize(19);
        report.setDefaultFont(font);
        report.scaleTo(2, 50);
        report.mainTable()->setTableBreakingPageOrder(Report::RightThenDown);
        QCOMPARE(report.numberOfPages(), 6);
        // With point size 10, initially I was getting 0.583037. With FontScaler: 0.524504.
        // With pixel sizes: 0.478, on both machines.
        // Autobuild on linux gets 37 rows instead of 43, though (taller font, by one pixel...)
        qDebug() << report.mainTable()->lastAutoFontScalingFactor();
#ifdef Q_OS_MAC
        // Bah, fonts change too much.
        return;
        QVERIFY(report.mainTable()->lastAutoFontScalingFactor() >= 0.37);
        QVERIFY(report.mainTable()->lastAutoFontScalingFactor() <= 0.39);
#else
        QVERIFY(report.mainTable()->lastAutoFontScalingFactor() >= 0.45);
        QVERIFY(report.mainTable()->lastAutoFontScalingFactor() <= 0.50);
#endif
        const int rows = report.mainTable()->pageRects()[0].height();
        qDebug() << rows << "rows";
        QVERIFY(rows >= 37);
        QVERIFY(rows <= 48);
        const int columns = report.mainTable()->pageRects()[0].width();
        QVERIFY(columns >= 20);
        QVERIFY(columns <= 21);

        // qDebug() << report.mainTable()->pageRects();
        QCOMPARE(report.mainTable()->pageRects()[0], QRect(0, 0, columns, rows));
        QCOMPARE(report.mainTable()->pageRects()[1], QRect(columns, 0, 40 - columns, rows));
        QCOMPARE(report.mainTable()->pageRects()[2], QRect(0, rows, columns, rows));
        QCOMPARE(report.mainTable()->pageRects()[3], QRect(columns, rows, 40 - columns, rows));
        QCOMPARE(report.mainTable()->pageRects()[4], QRect(0, 2 * rows, columns, 100 - 2 * rows));
        QCOMPARE(report.mainTable()->pageRects()[5], QRect(columns, 2 * rows, 40 - columns, 100 - 2 * rows));

        report.setTableBreakingPageOrder(Report::DownThenRight);
        // qDebug() << report.mainTable()->pageRects();
        QCOMPARE(report.mainTable()->pageRects(),
                 QList<QRect>() << QRect(0, 0, columns, rows) << QRect(0, rows, columns, rows) << QRect(0, 2 * rows, columns, 100 - 2 * rows) << QRect(columns, 0, 40 - columns, rows)
                                << QRect(columns, rows, 40 - columns, rows) << QRect(columns, 2 * rows, 40 - columns, 100 - 2 * rows));
    }